

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.cpp
# Opt level: O2

char * findlocal(lua_State *L,CallInfo *ci,int n,StkId *pos)

{
  byte bVar1;
  Proto *f;
  int pc;
  char *pcVar2;
  StkId pTVar3;
  CallInfo *pCVar4;
  
  if ((ci->callstatus & 1) == 0) {
    pTVar3 = ci->func + 1;
LAB_001068e0:
    if (L->ci == ci) {
      pCVar4 = (CallInfo *)&L->top;
    }
    else {
      pCVar4 = ci->next;
    }
    if (n < 1) {
      return (char *)0x0;
    }
    if ((long)pCVar4->func - (long)pTVar3 >> 4 < (long)n) {
      return (char *)0x0;
    }
    pcVar2 = "(*temporary)";
  }
  else {
    if (n < 0) {
      pTVar3 = ci->func;
      bVar1 = *(byte *)(*(long *)((pTVar3->value_).f + 0x18) + 0x78);
      if ((long)(((long)(ci->u).l.base - (long)pTVar3 >> 4) - (ulong)bVar1) <= (long)(ulong)(uint)-n
         ) {
        return (char *)0x0;
      }
      pTVar3 = pTVar3 + (ulong)bVar1 + (ulong)(uint)-n;
      pcVar2 = "(*vararg)";
      goto LAB_00106953;
    }
    pTVar3 = (ci->u).l.base;
    f = *(Proto **)((ci->func->value_).f + 0x18);
    pc = currentpc(ci);
    pcVar2 = luaF_getlocalname(f,n,pc);
    if (pcVar2 == (char *)0x0) goto LAB_001068e0;
  }
  pTVar3 = pTVar3 + (long)n + -1;
LAB_00106953:
  *pos = pTVar3;
  return pcVar2;
}

Assistant:

static const char *findlocal (lua_State *L, CallInfo *ci, int n,
                              StkId *pos) {
  const char *name = NULL;
  StkId base;
  if (isLua(ci)) {
    if (n < 0)  /* access to vararg values? */
      return findvararg(ci, -n, pos);
    else {
      base = ci->u.l.base;
      name = luaF_getlocalname(ci_func(ci)->p, n, currentpc(ci));
    }
  }
  else
    base = ci->func + 1;
  if (name == NULL) {  /* no 'standard' name? */
    StkId limit = (ci == L->ci) ? L->top : ci->next->func;
    if (limit - base >= n && n > 0)  /* is 'n' inside 'ci' stack? */
      name = "(*temporary)";  /* generic name for any valid slot */
    else
      return NULL;  /* no name */
  }
  *pos = base + (n - 1);
  return name;
}